

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttf.c
# Opt level: O0

int ttf_text_length(ALLEGRO_FONT *f,ALLEGRO_USTR *text)

{
  int iVar1;
  int iVar2;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int32_t nch;
  int32_t ch;
  int x;
  int pos;
  int local_34;
  int local_20;
  int local_18;
  undefined4 local_14;
  undefined8 local_10;
  undefined8 local_8;
  
  local_14 = 0;
  local_18 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = al_ustr_get_next(in_RSI,&local_14);
  while (-1 < local_20) {
    iVar1 = al_ustr_get_next(local_10,&local_14);
    local_34 = iVar1;
    if (iVar1 < 0) {
      local_34 = -1;
    }
    iVar2 = al_get_glyph_advance(local_8,local_20,local_34);
    local_18 = iVar2 + local_18;
    local_20 = iVar1;
  }
  return local_18;
}

Assistant:

static int ttf_text_length(ALLEGRO_FONT const *f, const ALLEGRO_USTR *text)
{
   int pos = 0;
   int x = 0;
   int32_t ch, nch;

   nch = al_ustr_get_next(text, &pos);
   while (nch >= 0) {
      ch = nch;
      nch = al_ustr_get_next(text, &pos);

      x += al_get_glyph_advance(f, ch, nch < 0 ?
         ALLEGRO_NO_KERNING : nch);
   }

   return x;
}